

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fr.h
# Opt level: O2

void __thiscall FR<8U>::Init(FR<8U> *this,Data<8U> *data)

{
  byte bVar1;
  uchar *puVar2;
  ulong uVar3;
  uint position;
  uint uVar4;
  int i;
  uint uVar5;
  Counter *pCVar6;
  bool bVar7;
  
  bVar7 = true;
  for (uVar5 = 0; uVar5 != 3; uVar5 = uVar5 + 1) {
    uVar4 = Data<8U>::Hash(data,uVar5);
    uVar3 = (ulong)uVar4 % (ulong)(uint)this->LENGTH;
    puVar2 = this->bitset->bitset;
    bVar1 = puVar2[uVar3 >> 3];
    if ((bVar1 >> ((uint)uVar3 & 7) & 1) == 0) {
      puVar2[uVar3 >> 3] = (byte)(1 << ((byte)uVar3 & 7)) | bVar1;
      bVar7 = false;
    }
  }
  for (uVar5 = 0; uVar5 != 2; uVar5 = uVar5 + 1) {
    uVar4 = Data<8U>::Hash(data,uVar5);
    uVar3 = (ulong)uVar4 % (ulong)(uint)this->SIZE;
    pCVar6 = this->counter;
    if (!bVar7) {
      this->flow = this->flow + 1;
      Data<8U>::operator^=(&pCVar6[uVar3].data,data);
      pCVar6 = this->counter;
      pCVar6[uVar3].count = pCVar6[uVar3].count + 1;
    }
    pCVar6[uVar3].packet = pCVar6[uVar3].packet + 1;
  }
  return;
}

Assistant:

void Init(const Data<DATA_LEN>& data) {
		bool init = true;
		for (int i = 0; i < 3; ++i) {
			uint position = data.Hash(i) % LENGTH;
			if (!bitset->Get(position)) {
				init = false;
				bitset->Set(position);
			}
		}

		for (int i = 0; i < 2; ++i) {
			uint position = data.Hash(i) % SIZE;
			if (!init) {
				flow++;
				counter[position].data ^= data;
				counter[position].count += 1;
			}
			counter[position].packet += 1;
		}
	}